

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::IsInsufficient
          (MP<135UL,_GF2::MOLex<135UL>_> *this,WW<135UL> *vars)

{
  _List_node_base *p_Var1;
  size_t pos;
  long lVar2;
  bool bVar3;
  word local_18 [3];
  
  p_Var1 = (this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
           super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while( true ) {
    bVar3 = p_Var1 == (_List_node_base *)this;
    if (bVar3) {
      return bVar3;
    }
    local_18[2] = vars->_words[2];
    local_18[0] = vars->_words[0];
    local_18[1] = vars->_words[1];
    lVar2 = 0;
    do {
      local_18[lVar2] = local_18[lVar2] & *(size_t *)((long)(p_Var1 + 1) + lVar2 * 8);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    if (local_18[0] != 0) {
      return bVar3;
    }
    if (local_18[1] != 0) {
      return bVar3;
    }
    if (local_18[2] != 0) break;
    p_Var1 = (((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)&p_Var1->_M_next)->
             super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  return bVar3;
}

Assistant:

bool IsInsufficient(const WW<_n>& vars) const
	{
		WW<_n> mask;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			if (!((mask = vars) &= *iter).IsAllZero())
				return false;
		return true;
	}